

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O2

MPP_RET mpp_dec_notify(MppDec ctx,RK_U32 flag)

{
  code *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p in flag %08x\n","mpp_dec_notify",ctx,flag);
  }
  if ((flag >> 10 & 1) != 0 && *(MppDecVprocCtx *)((long)ctx + 0x218) != (MppDecVprocCtx)0x0) {
    dec_vproc_signal(*(MppDecVprocCtx *)((long)ctx + 0x218));
  }
  uVar3 = 0;
  if ((*(long *)((long)ctx + 8) != 0) &&
     (pcVar1 = *(code **)(*(long *)((long)ctx + 8) + 0x18), pcVar1 != (code *)0x0)) {
    uVar2 = (*pcVar1)(ctx,flag);
    uVar3 = (ulong)uVar2;
  }
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_notify",ctx,uVar3);
  }
  return (MPP_RET)uVar3;
}

Assistant:

MPP_RET mpp_dec_notify(MppDec ctx, RK_U32 flag)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    dec_dbg_func("%p in flag %08x\n", dec, flag);

    if (dec->vproc && (flag & MPP_DEC_NOTIFY_BUFFER_MATCH))
        dec_vproc_signal(dec->vproc);

    if (dec->api && dec->api->notify)
        ret = dec->api->notify(dec, flag);

    dec_dbg_func("%p out ret %d\n", dec, ret);

    return ret;
}